

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::binaryByComponent<double,_double,_int>::call
          (binaryByComponent<double,_double,_int> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  GLuint x;
  GLuint y;
  uint uVar3;
  undefined8 uVar4;
  int second_arg;
  double first_arg;
  GLuint component;
  functionPointer p_function;
  GLuint component_step_1;
  GLuint component_step_0;
  GLuint n_components;
  GLuint n_components_1;
  GLuint n_components_0;
  int *p_arg_2;
  double *p_arg_1;
  double *p_result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  binaryByComponent<double,_double,_int> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,1);
  x = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,0);
  y = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,1);
  uVar3 = de::max<unsigned_int>(x,y);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  for (first_arg._4_4_ = 0; first_arg._4_4_ < uVar3; first_arg._4_4_ = first_arg._4_4_ + 1) {
    uVar4 = (*pcVar1)(*(undefined8 *)((long)argument_src + (ulong)(first_arg._4_4_ * (x != 1)) * 8),
                      *(undefined4 *)
                       ((long)argument_src + (ulong)(first_arg._4_4_ * (y != 1)) * 4 + (ulong)GVar2)
                     );
    *(undefined8 *)((long)result_dst + (ulong)first_arg._4_4_ * 8) = uVar4;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT*  p_result = (ResT*)result_dst;
		Arg1T* p_arg_1  = (Arg1T*)argument_src;
		Arg2T* p_arg_2  = (Arg2T*)((glw::GLubyte*)argument_src + getArgumentOffset(1));

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components   = de::max(n_components_0, n_components_1);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const Arg1T first_arg  = p_arg_1[component * component_step_0];
			const Arg2T second_arg = p_arg_2[component * component_step_1];

			p_result[component] = p_function(first_arg, second_arg);
		}
	}